

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcGen.c
# Opt level: O3

int Gia_ManTestSatEnum(Gia_Man_t *p)

{
  word *pwVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  sat_solver *s;
  uint *puVar5;
  void *__ptr;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  Cnf_Dat_t *pCVar10;
  Vec_Wrd_t *__ptr_00;
  long lVar11;
  timespec ts;
  int iLit;
  timespec local_78;
  Cnf_Dat_t *local_68;
  uint *local_60;
  int local_54;
  uint local_50;
  lit local_4c;
  sat_solver *local_48;
  long local_40;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  local_68 = Mf_ManGenerateCnf(p,8,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(local_68,1,0);
  puVar5 = (uint *)malloc(0x10);
  *puVar5 = 1000;
  __ptr = malloc(4000);
  *(void **)(puVar5 + 2) = __ptr;
  local_4c = 2;
  local_60 = puVar5;
  local_48 = s;
  iVar2 = sat_solver_addclause(s,&local_4c,(lit *)&local_48);
  if (iVar2 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcGen.c"
                  ,0x8f,"int Gia_ManTestSatEnum(Gia_Man_t *)");
  }
  Gia_ManMoFindSimulate(p,1);
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = *p->vCos->pArray;
  if ((iVar2 < 0) || (p->nObjs <= iVar2)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar3 = iVar2 * p->iPatsPi;
  local_38 = lVar7;
  if (((int)uVar3 < 0) || (p->vSims->nSize <= (int)uVar3)) {
LAB_005427d0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                  ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  pwVar1 = p->vSims->pArray;
  uVar8 = 0;
  do {
    printf("%d",(ulong)((*(uint *)((long)pwVar1 + (ulong)(uVar8 >> 5) * 4 + (ulong)uVar3 * 8) >>
                         (uVar8 & 0x1f) & 1) != 0));
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x40);
  putchar(10);
  lVar7 = 0;
  uVar3 = 0;
  uVar6 = 0;
  do {
    local_60[1] = 0;
    iVar2 = p->nObjs;
    local_54 = (int)uVar6;
    local_50 = uVar3;
    local_40 = lVar7;
    if (0 < iVar2) {
      lVar7 = 0;
      pCVar10 = local_68;
      puVar5 = local_60;
      do {
        iVar4 = pCVar10->pVarNums[lVar7];
        if (iVar4 != -1) {
          uVar3 = p->iPatsPi * (int)lVar7;
          if (((int)uVar3 < 0) || (p->vSims->nSize <= (int)uVar3)) goto LAB_005427d0;
          if ((*(uint *)((long)p->vSims->pArray + (uVar6 >> 5) * 4 + (ulong)uVar3 * 8) &
              1 << ((byte)uVar6 & 0x1f)) != 0) {
            uVar3 = puVar5[1];
            if (uVar3 == *puVar5) {
              if ((int)uVar3 < 0x10) {
                if (__ptr == (void *)0x0) {
                  __ptr = malloc(0x40);
                }
                else {
                  __ptr = realloc(__ptr,0x40);
                }
                *(void **)(local_60 + 2) = __ptr;
                uVar8 = 0x10;
                if (__ptr == (void *)0x0) {
LAB_005427ef:
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
              }
              else {
                if (__ptr == (void *)0x0) {
                  __ptr = malloc((ulong)uVar3 * 8);
                }
                else {
                  __ptr = realloc(__ptr,(ulong)uVar3 * 8);
                }
                *(void **)(local_60 + 2) = __ptr;
                if (__ptr == (void *)0x0) goto LAB_005427ef;
                uVar8 = uVar3 * 2;
              }
              *local_60 = uVar8;
              pCVar10 = local_68;
              puVar5 = local_60;
            }
            puVar5[1] = uVar3 + 1;
            *(int *)((long)__ptr + (long)(int)uVar3 * 4) = iVar4;
            iVar2 = p->nObjs;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar2);
    }
    iVar2 = clock_gettime(3,&local_78);
    lVar11 = local_40;
    if (iVar2 < 0) {
      lVar9 = 1;
    }
    else {
      lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
      lVar9 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_78.tv_sec * -1000000;
    }
    iVar2 = sat_solver_solve(local_48,(lit *)0x0,(lit *)0x0,0,0,0,0);
    iVar4 = clock_gettime(3,&local_78);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar7 = lVar11 + lVar9 + lVar7;
    putchar((uint)(iVar2 != 1) * 2 + 0x2b);
    uVar3 = local_50 + (iVar2 == 1);
    uVar6 = (ulong)(local_54 + 1U);
  } while (local_54 + 1U != 0x40);
  putchar(10);
  printf("Finished generating %d assignments.  ",(ulong)uVar3);
  iVar4 = 3;
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  lVar11 = lVar11 + local_38;
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)lVar11 / 1000000.0);
  Abc_Print(iVar4,"%s =","SAT solver time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)lVar7 / 1000000.0);
  __ptr_00 = p->vSims;
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    if (__ptr_00->pArray != (word *)0x0) {
      free(__ptr_00->pArray);
      p->vSims->pArray = (word *)0x0;
      __ptr_00 = p->vSims;
      if (__ptr_00 == (Vec_Wrd_t *)0x0) goto LAB_00542791;
    }
    free(__ptr_00);
    p->vSims = (Vec_Wrd_t *)0x0;
  }
LAB_00542791:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  free(local_60);
  sat_solver_delete(local_48);
  Cnf_DataFree(local_68);
  return 1;
}

Assistant:

int Gia_ManTestSatEnum( Gia_Man_t * p )
{
    abctime clk = Abc_Clock(), clk2, clkTotal = 0;
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    int i, v, status, iLit, nWords = 1, iOutVar = 1, Count = 0;
    Vec_Int_t * vVars = Vec_IntAlloc( 1000 );
    word * pSimInfo;

    // add literals to the solver
    iLit  = Abc_Var2Lit( iOutVar, 0 ); 
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );

    // simulate the AIG
    Gia_ManMoFindSimulate( p, nWords );

    // print outputs
    pSimInfo = Gia_ManMoObj( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    for ( i = 0; i < 64*nWords; i++ )
        printf( "%d", Abc_InfoHasBit( (unsigned *)pSimInfo, i ) );
    printf( "\n" );

    // iterate through the assignments
    for ( i = 0; i < 64*nWords; i++ )
    {
        Vec_IntClear( vVars );
        for ( v = 0; v < Gia_ManObjNum(p); v++ )
        {
            if ( pCnf->pVarNums[v] == -1 )
                continue;
            pSimInfo = Gia_ManMoObj( p, v );
            if ( !Abc_InfoHasBit( (unsigned *)pSimInfo, i ) )
                continue;
            Vec_IntPush( vVars, pCnf->pVarNums[v] );
        }
        //sat_solver_act_var_clear( pSat );
        //sat_solver_set_polarity( pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );

        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        clkTotal += Abc_Clock() - clk2;
        printf( "%c", status == l_True ? '+' : '-' );
        if ( status == l_True )
            Count++;
    }
    printf( "\n" );
    printf( "Finished generating %d assignments.  ", Count );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_PrintTime( 1, "SAT solver time", clkTotal );

    Vec_WrdFreeP( &p->vSims );
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return 1;
}